

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdc-reader.cc
# Opt level: O0

void tinyusdz::usdc::RegisterPrimAttrTypes
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *d)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar1;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar2;
  allocator local_c39;
  value_type local_c38 [4];
  _Base_ptr local_c18;
  undefined1 local_c10;
  allocator local_c01;
  value_type local_c00 [4];
  _Base_ptr local_be0;
  undefined1 local_bd8;
  allocator local_bc9;
  value_type local_bc8 [4];
  _Base_ptr local_ba8;
  undefined1 local_ba0;
  allocator local_b91;
  value_type local_b90 [4];
  _Base_ptr local_b70;
  undefined1 local_b68;
  allocator local_b59;
  value_type local_b58 [4];
  _Base_ptr local_b38;
  undefined1 local_b30;
  allocator local_b21;
  value_type local_b20 [4];
  _Base_ptr local_b00;
  undefined1 local_af8;
  allocator local_ae9;
  value_type local_ae8 [4];
  _Base_ptr local_ac8;
  undefined1 local_ac0;
  allocator local_ab1;
  value_type local_ab0 [4];
  _Base_ptr local_a90;
  undefined1 local_a88;
  allocator local_a79;
  value_type local_a78 [4];
  _Base_ptr local_a58;
  undefined1 local_a50;
  allocator local_a41;
  value_type local_a40 [4];
  _Base_ptr local_a20;
  undefined1 local_a18;
  allocator local_a09;
  value_type local_a08 [4];
  _Base_ptr local_9e8;
  undefined1 local_9e0;
  allocator local_9d1;
  value_type local_9d0 [4];
  _Base_ptr local_9b0;
  undefined1 local_9a8;
  allocator local_999;
  value_type local_998 [4];
  _Base_ptr local_978;
  undefined1 local_970;
  allocator local_961;
  value_type local_960 [4];
  _Base_ptr local_940;
  undefined1 local_938;
  allocator local_929;
  value_type local_928 [4];
  _Base_ptr local_908;
  undefined1 local_900;
  allocator local_8f1;
  value_type local_8f0 [4];
  _Base_ptr local_8d0;
  undefined1 local_8c8;
  allocator local_8b9;
  value_type local_8b8 [4];
  _Base_ptr local_898;
  undefined1 local_890;
  allocator local_881;
  value_type local_880 [4];
  _Base_ptr local_860;
  undefined1 local_858;
  allocator local_849;
  value_type local_848 [4];
  _Base_ptr local_828;
  undefined1 local_820;
  allocator local_811;
  value_type local_810 [4];
  _Base_ptr local_7f0;
  undefined1 local_7e8;
  allocator local_7d9;
  value_type local_7d8 [4];
  _Base_ptr local_7b8;
  undefined1 local_7b0;
  allocator local_7a1;
  value_type local_7a0 [4];
  _Base_ptr local_780;
  undefined1 local_778;
  allocator local_769;
  value_type local_768 [4];
  _Base_ptr local_748;
  undefined1 local_740;
  allocator local_731;
  value_type local_730 [4];
  _Base_ptr local_710;
  undefined1 local_708;
  allocator local_6f9;
  value_type local_6f8 [4];
  _Base_ptr local_6d8;
  undefined1 local_6d0;
  allocator local_6c1;
  value_type local_6c0 [4];
  _Base_ptr local_6a0;
  undefined1 local_698;
  allocator local_689;
  value_type local_688 [4];
  _Base_ptr local_668;
  undefined1 local_660;
  allocator local_651;
  value_type local_650 [4];
  _Base_ptr local_630;
  undefined1 local_628;
  allocator local_619;
  value_type local_618 [4];
  _Base_ptr local_5f8;
  undefined1 local_5f0;
  allocator local_5e1;
  value_type local_5e0 [4];
  _Base_ptr local_5c0;
  undefined1 local_5b8;
  allocator local_5a9;
  value_type local_5a8 [4];
  _Base_ptr local_588;
  undefined1 local_580;
  allocator local_571;
  value_type local_570 [4];
  _Base_ptr local_550;
  undefined1 local_548;
  allocator local_539;
  value_type local_538 [4];
  _Base_ptr local_518;
  undefined1 local_510;
  allocator local_501;
  value_type local_500 [4];
  _Base_ptr local_4e0;
  undefined1 local_4d8;
  allocator local_4c9;
  value_type local_4c8 [4];
  _Base_ptr local_4a8;
  undefined1 local_4a0;
  allocator local_491;
  value_type local_490 [4];
  _Base_ptr local_470;
  undefined1 local_468;
  allocator local_459;
  value_type local_458 [4];
  _Base_ptr local_438;
  undefined1 local_430;
  allocator local_421;
  value_type local_420 [4];
  _Base_ptr local_400;
  undefined1 local_3f8;
  allocator local_3e9;
  value_type local_3e8 [4];
  _Base_ptr local_3c8;
  undefined1 local_3c0;
  allocator local_3b1;
  value_type local_3b0 [4];
  _Base_ptr local_390;
  undefined1 local_388;
  allocator local_379;
  value_type local_378 [4];
  _Base_ptr local_358;
  undefined1 local_350;
  allocator local_341;
  value_type local_340 [4];
  _Base_ptr local_320;
  undefined1 local_318;
  allocator local_309;
  value_type local_308 [4];
  _Base_ptr local_2e8;
  undefined1 local_2e0;
  allocator local_2d1;
  value_type local_2d0 [4];
  _Base_ptr local_2b0;
  undefined1 local_2a8;
  allocator local_299;
  value_type local_298 [4];
  _Base_ptr local_278;
  undefined1 local_270;
  allocator local_261;
  value_type local_260 [4];
  _Base_ptr local_240;
  undefined1 local_238;
  allocator local_229;
  value_type local_228 [4];
  _Base_ptr local_208;
  undefined1 local_200;
  allocator local_1f1;
  value_type local_1f0 [4];
  _Base_ptr local_1d0;
  undefined1 local_1c8;
  allocator local_1b9;
  value_type local_1b8 [4];
  _Base_ptr local_198;
  undefined1 local_190;
  allocator local_181;
  value_type local_180 [4];
  _Base_ptr local_160;
  undefined1 local_158;
  allocator local_149;
  value_type local_148 [4];
  _Base_ptr local_128;
  undefined1 local_120;
  allocator local_111;
  value_type local_110 [4];
  _Base_ptr local_f0;
  undefined1 local_e8;
  allocator local_d9;
  value_type local_d8 [4];
  _Base_ptr local_b8;
  undefined1 local_b0;
  allocator local_a1;
  value_type local_a0 [4];
  _Base_ptr local_80;
  undefined1 local_78;
  allocator local_69;
  value_type local_68 [4];
  _Base_ptr local_48;
  undefined1 local_40;
  allocator local_31;
  value_type local_30 [4];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_10;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *d_local;
  
  local_10 = d;
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(d);
  psVar1 = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_30,"bool",&local_31);
  pVar2 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(psVar1,local_30);
  local_48 = (_Base_ptr)pVar2.first._M_node;
  local_40 = pVar2.second;
  ::std::__cxx11::string::~string((string *)local_30);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_31);
  psVar1 = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_68,"int64",&local_69);
  pVar2 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(psVar1,local_68);
  local_80 = (_Base_ptr)pVar2.first._M_node;
  local_78 = pVar2.second;
  ::std::__cxx11::string::~string((string *)local_68);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_69);
  psVar1 = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_a0,"int",&local_a1);
  pVar2 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(psVar1,local_a0);
  local_b8 = (_Base_ptr)pVar2.first._M_node;
  local_b0 = pVar2.second;
  ::std::__cxx11::string::~string((string *)local_a0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  psVar1 = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_d8,"int2",&local_d9);
  pVar2 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(psVar1,local_d8);
  local_f0 = (_Base_ptr)pVar2.first._M_node;
  local_e8 = pVar2.second;
  ::std::__cxx11::string::~string((string *)local_d8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  psVar1 = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_110,"int3",&local_111);
  pVar2 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(psVar1,local_110);
  local_128 = (_Base_ptr)pVar2.first._M_node;
  local_120 = pVar2.second;
  ::std::__cxx11::string::~string((string *)local_110);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_111);
  psVar1 = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_148,"int4",&local_149);
  pVar2 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(psVar1,local_148);
  local_160 = (_Base_ptr)pVar2.first._M_node;
  local_158 = pVar2.second;
  ::std::__cxx11::string::~string((string *)local_148);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_149);
  psVar1 = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_180,"uint64",&local_181);
  pVar2 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(psVar1,local_180);
  local_198 = (_Base_ptr)pVar2.first._M_node;
  local_190 = pVar2.second;
  ::std::__cxx11::string::~string((string *)local_180);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_181);
  psVar1 = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_1b8,"uint",&local_1b9);
  pVar2 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(psVar1,local_1b8);
  local_1d0 = (_Base_ptr)pVar2.first._M_node;
  local_1c8 = pVar2.second;
  ::std::__cxx11::string::~string((string *)local_1b8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  psVar1 = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_1f0,"uint2",&local_1f1);
  pVar2 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(psVar1,local_1f0);
  local_208 = (_Base_ptr)pVar2.first._M_node;
  local_200 = pVar2.second;
  ::std::__cxx11::string::~string((string *)local_1f0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  psVar1 = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_228,"uint3",&local_229);
  pVar2 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(psVar1,local_228);
  local_240 = (_Base_ptr)pVar2.first._M_node;
  local_238 = pVar2.second;
  ::std::__cxx11::string::~string((string *)local_228);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_229);
  psVar1 = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_260,"uint4",&local_261);
  pVar2 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(psVar1,local_260);
  local_278 = (_Base_ptr)pVar2.first._M_node;
  local_270 = pVar2.second;
  ::std::__cxx11::string::~string((string *)local_260);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_261);
  psVar1 = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_298,"float",&local_299);
  pVar2 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(psVar1,local_298);
  local_2b0 = (_Base_ptr)pVar2.first._M_node;
  local_2a8 = pVar2.second;
  ::std::__cxx11::string::~string((string *)local_298);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_299);
  psVar1 = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_2d0,"float2",&local_2d1);
  pVar2 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(psVar1,local_2d0);
  local_2e8 = (_Base_ptr)pVar2.first._M_node;
  local_2e0 = pVar2.second;
  ::std::__cxx11::string::~string((string *)local_2d0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
  psVar1 = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_308,"float3",&local_309);
  pVar2 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(psVar1,local_308);
  local_320 = (_Base_ptr)pVar2.first._M_node;
  local_318 = pVar2.second;
  ::std::__cxx11::string::~string((string *)local_308);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_309);
  psVar1 = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_340,"float4",&local_341);
  pVar2 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(psVar1,local_340);
  local_358 = (_Base_ptr)pVar2.first._M_node;
  local_350 = pVar2.second;
  ::std::__cxx11::string::~string((string *)local_340);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_341);
  psVar1 = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_378,"double",&local_379);
  pVar2 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(psVar1,local_378);
  local_390 = (_Base_ptr)pVar2.first._M_node;
  local_388 = pVar2.second;
  ::std::__cxx11::string::~string((string *)local_378);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_379);
  psVar1 = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_3b0,"double2",&local_3b1);
  pVar2 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(psVar1,local_3b0);
  local_3c8 = (_Base_ptr)pVar2.first._M_node;
  local_3c0 = pVar2.second;
  ::std::__cxx11::string::~string((string *)local_3b0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
  psVar1 = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_3e8,"double3",&local_3e9);
  pVar2 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(psVar1,local_3e8);
  local_400 = (_Base_ptr)pVar2.first._M_node;
  local_3f8 = pVar2.second;
  ::std::__cxx11::string::~string((string *)local_3e8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
  psVar1 = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_420,"double4",&local_421);
  pVar2 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(psVar1,local_420);
  local_438 = (_Base_ptr)pVar2.first._M_node;
  local_430 = pVar2.second;
  ::std::__cxx11::string::~string((string *)local_420);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_421);
  psVar1 = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_458,"half",&local_459);
  pVar2 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(psVar1,local_458);
  local_470 = (_Base_ptr)pVar2.first._M_node;
  local_468 = pVar2.second;
  ::std::__cxx11::string::~string((string *)local_458);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_459);
  psVar1 = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_490,"half2",&local_491);
  pVar2 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(psVar1,local_490);
  local_4a8 = (_Base_ptr)pVar2.first._M_node;
  local_4a0 = pVar2.second;
  ::std::__cxx11::string::~string((string *)local_490);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_491);
  psVar1 = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_4c8,"half3",&local_4c9);
  pVar2 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(psVar1,local_4c8);
  local_4e0 = (_Base_ptr)pVar2.first._M_node;
  local_4d8 = pVar2.second;
  ::std::__cxx11::string::~string((string *)local_4c8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
  psVar1 = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_500,"half4",&local_501);
  pVar2 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(psVar1,local_500);
  local_518 = (_Base_ptr)pVar2.first._M_node;
  local_510 = pVar2.second;
  ::std::__cxx11::string::~string((string *)local_500);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_501);
  psVar1 = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_538,"quath",&local_539);
  pVar2 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(psVar1,local_538);
  local_550 = (_Base_ptr)pVar2.first._M_node;
  local_548 = pVar2.second;
  ::std::__cxx11::string::~string((string *)local_538);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_539);
  psVar1 = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_570,"quatf",&local_571);
  pVar2 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(psVar1,local_570);
  local_588 = (_Base_ptr)pVar2.first._M_node;
  local_580 = pVar2.second;
  ::std::__cxx11::string::~string((string *)local_570);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_571);
  psVar1 = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_5a8,"quatd",&local_5a9);
  pVar2 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(psVar1,local_5a8);
  local_5c0 = (_Base_ptr)pVar2.first._M_node;
  local_5b8 = pVar2.second;
  ::std::__cxx11::string::~string((string *)local_5a8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_5a9);
  psVar1 = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_5e0,"normal3f",&local_5e1);
  pVar2 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(psVar1,local_5e0);
  local_5f8 = (_Base_ptr)pVar2.first._M_node;
  local_5f0 = pVar2.second;
  ::std::__cxx11::string::~string((string *)local_5e0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
  psVar1 = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_618,"point3f",&local_619);
  pVar2 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(psVar1,local_618);
  local_630 = (_Base_ptr)pVar2.first._M_node;
  local_628 = pVar2.second;
  ::std::__cxx11::string::~string((string *)local_618);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_619);
  psVar1 = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_650,"texCoord2h",&local_651);
  pVar2 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(psVar1,local_650);
  local_668 = (_Base_ptr)pVar2.first._M_node;
  local_660 = pVar2.second;
  ::std::__cxx11::string::~string((string *)local_650);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_651);
  psVar1 = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_688,"texCoord3h",&local_689);
  pVar2 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(psVar1,local_688);
  local_6a0 = (_Base_ptr)pVar2.first._M_node;
  local_698 = pVar2.second;
  ::std::__cxx11::string::~string((string *)local_688);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_689);
  psVar1 = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_6c0,"texCoord4h",&local_6c1);
  pVar2 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(psVar1,local_6c0);
  local_6d8 = (_Base_ptr)pVar2.first._M_node;
  local_6d0 = pVar2.second;
  ::std::__cxx11::string::~string((string *)local_6c0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_6c1);
  psVar1 = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_6f8,"texCoord2f",&local_6f9);
  pVar2 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(psVar1,local_6f8);
  local_710 = (_Base_ptr)pVar2.first._M_node;
  local_708 = pVar2.second;
  ::std::__cxx11::string::~string((string *)local_6f8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_6f9);
  psVar1 = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_730,"texCoord3f",&local_731);
  pVar2 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(psVar1,local_730);
  local_748 = (_Base_ptr)pVar2.first._M_node;
  local_740 = pVar2.second;
  ::std::__cxx11::string::~string((string *)local_730);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_731);
  psVar1 = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_768,"texCoord4f",&local_769);
  pVar2 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(psVar1,local_768);
  local_780 = (_Base_ptr)pVar2.first._M_node;
  local_778 = pVar2.second;
  ::std::__cxx11::string::~string((string *)local_768);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_769);
  psVar1 = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_7a0,"texCoord2d",&local_7a1);
  pVar2 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(psVar1,local_7a0);
  local_7b8 = (_Base_ptr)pVar2.first._M_node;
  local_7b0 = pVar2.second;
  ::std::__cxx11::string::~string((string *)local_7a0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_7a1);
  psVar1 = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_7d8,"texCoord3d",&local_7d9);
  pVar2 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(psVar1,local_7d8);
  local_7f0 = (_Base_ptr)pVar2.first._M_node;
  local_7e8 = pVar2.second;
  ::std::__cxx11::string::~string((string *)local_7d8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_7d9);
  psVar1 = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_810,"texCoord4d",&local_811);
  pVar2 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(psVar1,local_810);
  local_828 = (_Base_ptr)pVar2.first._M_node;
  local_820 = pVar2.second;
  ::std::__cxx11::string::~string((string *)local_810);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_811);
  psVar1 = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_848,"vector3f",&local_849);
  pVar2 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(psVar1,local_848);
  local_860 = (_Base_ptr)pVar2.first._M_node;
  local_858 = pVar2.second;
  ::std::__cxx11::string::~string((string *)local_848);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_849);
  psVar1 = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_880,"vector4f",&local_881);
  pVar2 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(psVar1,local_880);
  local_898 = (_Base_ptr)pVar2.first._M_node;
  local_890 = pVar2.second;
  ::std::__cxx11::string::~string((string *)local_880);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_881);
  psVar1 = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_8b8,"color3h",&local_8b9);
  pVar2 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(psVar1,local_8b8);
  local_8d0 = (_Base_ptr)pVar2.first._M_node;
  local_8c8 = pVar2.second;
  ::std::__cxx11::string::~string((string *)local_8b8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_8b9);
  psVar1 = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_8f0,"color3f",&local_8f1);
  pVar2 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(psVar1,local_8f0);
  local_908 = (_Base_ptr)pVar2.first._M_node;
  local_900 = pVar2.second;
  ::std::__cxx11::string::~string((string *)local_8f0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_8f1);
  psVar1 = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_928,"color3d",&local_929);
  pVar2 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(psVar1,local_928);
  local_940 = (_Base_ptr)pVar2.first._M_node;
  local_938 = pVar2.second;
  ::std::__cxx11::string::~string((string *)local_928);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_929);
  psVar1 = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_960,"color4h",&local_961);
  pVar2 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(psVar1,local_960);
  local_978 = (_Base_ptr)pVar2.first._M_node;
  local_970 = pVar2.second;
  ::std::__cxx11::string::~string((string *)local_960);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_961);
  psVar1 = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_998,"color4f",&local_999);
  pVar2 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(psVar1,local_998);
  local_9b0 = (_Base_ptr)pVar2.first._M_node;
  local_9a8 = pVar2.second;
  ::std::__cxx11::string::~string((string *)local_998);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_999);
  psVar1 = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_9d0,"color4d",&local_9d1);
  pVar2 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(psVar1,local_9d0);
  local_9e8 = (_Base_ptr)pVar2.first._M_node;
  local_9e0 = pVar2.second;
  ::std::__cxx11::string::~string((string *)local_9d0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_9d1);
  psVar1 = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_a08,"matrix2f",&local_a09);
  pVar2 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(psVar1,local_a08);
  local_a20 = (_Base_ptr)pVar2.first._M_node;
  local_a18 = pVar2.second;
  ::std::__cxx11::string::~string((string *)local_a08);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_a09);
  psVar1 = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_a40,"matrix3f",&local_a41);
  pVar2 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(psVar1,local_a40);
  local_a58 = (_Base_ptr)pVar2.first._M_node;
  local_a50 = pVar2.second;
  ::std::__cxx11::string::~string((string *)local_a40);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_a41);
  psVar1 = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_a78,"matrix4f",&local_a79);
  pVar2 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(psVar1,local_a78);
  local_a90 = (_Base_ptr)pVar2.first._M_node;
  local_a88 = pVar2.second;
  ::std::__cxx11::string::~string((string *)local_a78);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_a79);
  psVar1 = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_ab0,"matrix2d",&local_ab1);
  pVar2 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(psVar1,local_ab0);
  local_ac8 = (_Base_ptr)pVar2.first._M_node;
  local_ac0 = pVar2.second;
  ::std::__cxx11::string::~string((string *)local_ab0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_ab1);
  psVar1 = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_ae8,"matrix3d",&local_ae9);
  pVar2 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(psVar1,local_ae8);
  local_b00 = (_Base_ptr)pVar2.first._M_node;
  local_af8 = pVar2.second;
  ::std::__cxx11::string::~string((string *)local_ae8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_ae9);
  psVar1 = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_b20,"matrix4d",&local_b21);
  pVar2 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(psVar1,local_b20);
  local_b38 = (_Base_ptr)pVar2.first._M_node;
  local_b30 = pVar2.second;
  ::std::__cxx11::string::~string((string *)local_b20);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_b21);
  psVar1 = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_b58,"token",&local_b59);
  pVar2 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(psVar1,local_b58);
  local_b70 = (_Base_ptr)pVar2.first._M_node;
  local_b68 = pVar2.second;
  ::std::__cxx11::string::~string((string *)local_b58);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_b59);
  psVar1 = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_b90,"string",&local_b91);
  pVar2 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(psVar1,local_b90);
  local_ba8 = (_Base_ptr)pVar2.first._M_node;
  local_ba0 = pVar2.second;
  ::std::__cxx11::string::~string((string *)local_b90);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_b91);
  psVar1 = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_bc8,"rel",&local_bc9);
  pVar2 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(psVar1,local_bc8);
  local_be0 = (_Base_ptr)pVar2.first._M_node;
  local_bd8 = pVar2.second;
  ::std::__cxx11::string::~string((string *)local_bc8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_bc9);
  psVar1 = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_c00,"asset",&local_c01);
  pVar2 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(psVar1,local_c00);
  local_c18 = (_Base_ptr)pVar2.first._M_node;
  local_c10 = pVar2.second;
  ::std::__cxx11::string::~string((string *)local_c00);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_c01);
  psVar1 = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_c38,"dictionary",&local_c39);
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert(psVar1,local_c38);
  ::std::__cxx11::string::~string((string *)local_c38);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_c39);
  return;
}

Assistant:

static void RegisterPrimAttrTypes(std::set<std::string> &d) {
  d.clear();

  d.insert(value::kBool);

  d.insert(value::kInt64);

  d.insert(value::kInt);
  d.insert(value::kInt2);
  d.insert(value::kInt3);
  d.insert(value::kInt4);

  d.insert(value::kUInt64);

  d.insert(value::kUInt);
  d.insert(value::kUInt2);
  d.insert(value::kUInt3);
  d.insert(value::kUInt4);

  d.insert(value::kFloat);
  d.insert(value::kFloat2);
  d.insert(value::kFloat3);
  d.insert(value::kFloat4);

  d.insert(value::kDouble);
  d.insert(value::kDouble2);
  d.insert(value::kDouble3);
  d.insert(value::kDouble4);

  d.insert(value::kHalf);
  d.insert(value::kHalf2);
  d.insert(value::kHalf3);
  d.insert(value::kHalf4);

  d.insert(value::kQuath);
  d.insert(value::kQuatf);
  d.insert(value::kQuatd);

  d.insert(value::kNormal3f);
  d.insert(value::kPoint3f);
  d.insert(value::kTexCoord2h);
  d.insert(value::kTexCoord3h);
  d.insert(value::kTexCoord4h);
  d.insert(value::kTexCoord2f);
  d.insert(value::kTexCoord3f);
  d.insert(value::kTexCoord4f);
  d.insert(value::kTexCoord2d);
  d.insert(value::kTexCoord3d);
  d.insert(value::kTexCoord4d);
  d.insert(value::kVector3f);
  d.insert(value::kVector4f);
  d.insert(value::kColor3h);
  d.insert(value::kColor3f);
  d.insert(value::kColor3d);
  d.insert(value::kColor4h);
  d.insert(value::kColor4f);
  d.insert(value::kColor4d);

  // Allow `matrixNf` type for USDC
  d.insert(value::kMatrix2f);
  d.insert(value::kMatrix3f);
  d.insert(value::kMatrix4f);

  d.insert(value::kMatrix2d);
  d.insert(value::kMatrix3d);
  d.insert(value::kMatrix4d);

  d.insert(value::kToken);
  d.insert(value::kString);

  d.insert(value::kRelationship);
  d.insert(value::kAssetPath);

  d.insert(value::kDictionary);

  // variantSet. Require special treatment.
  // d.insert("variantSet");

  // TODO: Add more types...
}